

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar5;
  ImVec2 IVar3;
  ImVec2 IVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar2 = GImGui;
  fVar7 = size.x;
  fVar5 = size.y;
  if (0.0 <= fVar7) {
    fVar8 = 0.0;
    fVar9 = 0.0;
    if (0.0 <= fVar5) goto LAB_00116fbe;
  }
  pIVar1 = GImGui->CurrentWindow;
  IVar3 = GetContentRegionMax();
  IVar4 = pIVar1->Pos;
  fVar8 = IVar4.x + IVar3.x;
  fVar9 = IVar4.y + IVar3.y;
LAB_00116fbe:
  fVar6 = fVar7;
  if ((fVar7 <= 0.0) && ((fVar7 != 0.0 || (fVar6 = default_x, NAN(fVar7))))) {
    fVar8 = fVar8 - (pIVar2->CurrentWindow->DC).CursorPos.x;
    if (fVar8 <= 4.0) {
      fVar8 = 4.0;
    }
    fVar6 = fVar8 + fVar7;
  }
  fVar7 = fVar5;
  if ((fVar5 <= 0.0) && ((fVar5 != 0.0 || (fVar7 = default_y, NAN(fVar5))))) {
    fVar9 = fVar9 - (pIVar2->CurrentWindow->DC).CursorPos.y;
    if (fVar9 <= 4.0) {
      fVar9 = 4.0;
    }
    fVar7 = fVar5 + fVar9;
  }
  IVar4.y = fVar7;
  IVar4.x = fVar6;
  return IVar4;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}